

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

int __thiscall Indexing::ClauseCodeTree::ClauseMatcher::init(ClauseMatcher *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  LitInfo *pLVar2;
  uint uVar3;
  int extraout_EAX;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar4
  ;
  bool in_CL;
  uint uVar5;
  Clause *in_RDX;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  *this_00;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  LitInfo local_50;
  ulong local_38;
  
  this->query = in_RDX;
  this->tree = (ClauseCodeTree *)ctx;
  this->sres = in_CL;
  this_00 = (this->lms)._cursor;
  pRVar4 = (this->lms)._stack;
  while (this_00 != pRVar4) {
    this_00 = this_00 + -1;
    ::Lib::
    Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(this_00);
    pRVar4 = (this->lms)._stack;
  }
  (this->lms)._cursor = pRVar4;
  uVar1 = *(ulong *)&this->query->field_0x38;
  uVar5 = (uint)uVar1;
  uVar7 = uVar5 & 0xfffff;
  if ((uVar1 & 0xfffff) != 0) {
    uVar6 = 0;
    do {
      uVar7 = uVar7 + ((this->query->_literals[uVar6]->super_Term)._functor == 0);
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0xfffff) != uVar6);
  }
  ::Lib::DArray<Indexing::CodeTree::LitInfo>::ensure
            (&this->lInfos,(ulong)(uVar7 << (this->sres & 0x1fU)));
  if ((uVar1 & 0xfffff) == 0) {
    uVar6 = 0;
  }
  else {
    uVar10 = (ulong)(uVar5 & 0xfffff);
    uVar9 = 0;
    uVar6 = 0;
    local_38 = uVar10;
    do {
      uVar3 = Kernel::Term::numVarOccs(&this->query->_literals[uVar9]->super_Term);
      if (uVar3 == 0) {
        CodeTree::LitInfo::LitInfo(&local_50,this->query,(uint)uVar9);
        uVar11 = (uint)uVar6;
        pLVar2 = (this->lInfos)._array;
        pLVar2[uVar6].opposite = local_50.opposite;
        pLVar2 = pLVar2 + uVar6;
        pLVar2->liIndex = local_50.liIndex;
        pLVar2->litIndex = local_50.litIndex;
        pLVar2->ft = local_50.ft;
        pLVar2 = (this->lInfos)._array;
        pLVar2[uVar6].liIndex = uVar11;
        uVar3 = uVar11 + 1;
        if ((this->query->_literals[uVar9]->super_Term)._functor == 0) {
          CodeTree::LitInfo::getReversed(&local_50,pLVar2 + uVar6);
          pLVar2 = (this->lInfos)._array;
          pLVar2[uVar3].opposite = local_50.opposite;
          pLVar2 = pLVar2 + uVar3;
          pLVar2->liIndex = local_50.liIndex;
          pLVar2->litIndex = local_50.litIndex;
          pLVar2->ft = local_50.ft;
          (this->lInfos)._array[uVar3].liIndex = uVar3;
          uVar3 = uVar11 + 2;
        }
        uVar6 = (ulong)uVar3;
        uVar10 = local_38;
      }
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if ((uVar1 & 0xfffff) != 0) {
    uVar10 = 0;
    do {
      uVar3 = Kernel::Term::numVarOccs(&this->query->_literals[uVar10]->super_Term);
      if (uVar3 != 0) {
        CodeTree::LitInfo::LitInfo(&local_50,this->query,(uint)uVar10);
        uVar3 = (uint)uVar6;
        pLVar2 = (this->lInfos)._array;
        pLVar2[uVar6].opposite = local_50.opposite;
        pLVar2 = pLVar2 + uVar6;
        pLVar2->liIndex = local_50.liIndex;
        pLVar2->litIndex = local_50.litIndex;
        pLVar2->ft = local_50.ft;
        pLVar2 = (this->lInfos)._array;
        pLVar2[uVar6].liIndex = uVar3;
        uVar11 = uVar3 + 1;
        if ((this->query->_literals[uVar10]->super_Term)._functor == 0) {
          CodeTree::LitInfo::getReversed(&local_50,pLVar2 + uVar6);
          pLVar2 = (this->lInfos)._array;
          pLVar2[uVar11].opposite = local_50.opposite;
          pLVar2 = pLVar2 + uVar11;
          pLVar2->liIndex = local_50.liIndex;
          pLVar2->litIndex = local_50.litIndex;
          pLVar2->ft = local_50.ft;
          (this->lInfos)._array[uVar11].liIndex = uVar11;
          uVar6 = (ulong)(uVar3 + 2);
        }
        else {
          uVar6 = (ulong)uVar11;
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0xfffff) != uVar10);
  }
  if (this->sres == true) {
    if (uVar7 != 0) {
      uVar6 = (ulong)uVar7;
      lVar8 = 0;
      do {
        CodeTree::LitInfo::getOpposite
                  (&local_50,(LitInfo *)((long)&((this->lInfos)._array)->liIndex + lVar8));
        pLVar2 = (this->lInfos)._array;
        pLVar2[uVar7].opposite = local_50.opposite;
        pLVar2 = pLVar2 + uVar7;
        pLVar2->liIndex = local_50.liIndex;
        pLVar2->litIndex = local_50.litIndex;
        pLVar2->ft = local_50.ft;
        (this->lInfos)._array[uVar7].liIndex = uVar7;
        lVar8 = lVar8 + 0x18;
        uVar7 = uVar7 + 1;
      } while (uVar6 * 0x18 != lVar8);
    }
    this->sresLiteral = 0xffffffff;
  }
  CodeTree::incTimeStamp(&this->tree->super_CodeTree);
  enterLiteral(this,(CodeOp *)((this->tree->super_CodeTree)._entryPoint + 8),(uVar1 & 0xfffff) == 0)
  ;
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::init(ClauseCodeTree* tree_, Clause* query_, bool sres_)
{
  ASS(!tree_->isEmpty());

  query=query_;
  tree=tree_;
  sres=sres_;
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,0);
  tree->_clauseMatcherCounter++;
#endif

  //init LitInfo records
  unsigned clen=query->length();
  unsigned baseLICnt=clen;
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->isEquality()) {
      baseLICnt++;
    }
  }
  unsigned liCnt=sres ? (baseLICnt*2) : baseLICnt;
  lInfos.ensure(liCnt);

  //we put ground literals first
  unsigned liIndex=0;
  for(unsigned i=0;i<clen;i++) {
    if(!(*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  if(sres) {
    for(unsigned i=0;i<baseLICnt;i++) {
      unsigned newIndex=i+baseLICnt;
      lInfos[newIndex]=LitInfo::getOpposite(lInfos[i]);
      lInfos[newIndex].liIndex=newIndex;
    }
    sresLiteral=sresNoLiteral;
  }

  tree->incTimeStamp();
  enterLiteral(tree->getEntryPoint(), clen==0);
}